

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ion.c
# Opt level: O1

RK_S32 find_dir_in_path(char *path,char *dir_name,size_t max_length)

{
  int iVar1;
  size_t sVar2;
  RK_S32 RVar3;
  int iVar4;
  dirent **dir;
  dirent64 **local_28;
  
  sVar2 = strnlen(path,0x100);
  pthread_once(&once,scandir_lock_init);
  pthread_mutex_lock((pthread_mutex_t *)&scandir_lock);
  search_name = dir_name;
  iVar1 = scandir64(path,&local_28,_compare_name,alphasort64);
  if (iVar1 < 1) {
    RVar3 = 0;
    _mpp_log_l(4,"mpp_ion","scan %s for %s return %d\n",(char *)0x0,path,dir_name,iVar1);
  }
  else {
    if (iVar1 != 1) {
      _mpp_log_l(2,"mpp_ion","Assertion %s failed at %s:%d\n",(char *)0x0,"n == 1",
                 "find_dir_in_path",0xc1);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
    }
    iVar4 = (int)sVar2;
    iVar1 = snprintf(path + iVar4,0xff - (long)iVar4,"/%s",(*local_28)->d_name);
    RVar3 = iVar1 + iVar4;
    free(*local_28);
    free(local_28);
  }
  search_name = (char *)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)&scandir_lock);
  return RVar3;
}

Assistant:

static RK_S32 find_dir_in_path(char *path, const char *dir_name,
                               size_t max_length)
{
    struct dirent **dir;
    RK_S32 path_len = strnlen(path, max_length);
    RK_S32 new_path_len = 0;
    RK_S32 n;

    pthread_once(&once, scandir_lock_init);
    pthread_mutex_lock(&scandir_lock);
    search_name = dir_name;
    n = scandir(path, &dir, _compare_name, alphasort);
    if (n <= 0) {
        mpp_log("scan %s for %s return %d\n", path, dir_name, n);
    } else {
        mpp_assert(n == 1);

        new_path_len = path_len;
        new_path_len += snprintf(path + path_len, max_length - path_len - 1,
                                 "/%s", dir[0]->d_name);
        free(dir[0]);
        free(dir);
    }
    search_name = NULL;
    pthread_mutex_unlock(&scandir_lock);
    return new_path_len;
}